

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int pull_inner(FILE *fp,mg_connection *conn,char *buf,int len,double timeout)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  int local_54;
  int local_50;
  SOCKET local_48;
  int pollres;
  pollfd pfd [1];
  int err;
  int nread;
  double timeout_local;
  int len_local;
  char *buf_local;
  mg_connection *conn_local;
  FILE *fp_local;
  
  pfd[0].fd = 0;
  if (fp == (FILE *)0x0) {
    local_48 = (conn->client).sock;
    pollres._0_2_ = 1;
    iVar1 = mg_poll((pollfd *)&stack0xffffffffffffffb8,1,(int)(timeout * 1000.0),
                    &conn->phys_ctx->stop_flag);
    if (conn->phys_ctx->stop_flag != 0) {
      return -2;
    }
    if (iVar1 < 1) {
      if (iVar1 < 0) {
        return -2;
      }
      pfd[0].events = 0;
      pfd[0].revents = 0;
    }
    else {
      sVar2 = recv((conn->client).sock,buf,(long)len,0);
      pfd[0]._4_4_ = (undefined4)sVar2;
      if ((int)pfd[0]._4_4_ < 0) {
        piVar3 = __errno_location();
        local_54 = *piVar3;
      }
      else {
        local_54 = 0;
      }
      pfd[0].fd = local_54;
      if ((int)pfd[0]._4_4_ < 1) {
        return -2;
      }
    }
  }
  else {
    iVar1 = fileno((FILE *)fp);
    sVar2 = read(iVar1,buf,(long)len);
    pfd[0]._4_4_ = (undefined4)sVar2;
    if ((int)pfd[0]._4_4_ < 0) {
      piVar3 = __errno_location();
      local_50 = *piVar3;
    }
    else {
      local_50 = 0;
    }
    pfd[0].fd = local_50;
    if ((pfd[0]._4_4_ == 0) && (0 < len)) {
      return -2;
    }
  }
  if (conn->phys_ctx->stop_flag == 0) {
    if (((int)pfd[0]._4_4_ < 1) && ((pfd[0]._4_4_ != 0 || (len != 0)))) {
      if (((((int)pfd[0]._4_4_ < 0) && (pfd[0].fd != 0xb)) && (pfd[0].fd != 0xb)) &&
         (pfd[0].fd != 4)) {
        fp_local._4_4_ = -2;
      }
      else {
        fp_local._4_4_ = -1;
      }
    }
    else {
      fp_local._4_2_ = pfd[0].events;
      fp_local._6_2_ = pfd[0].revents;
    }
  }
  else {
    fp_local._4_4_ = -2;
  }
  return fp_local._4_4_;
}

Assistant:

static int
pull_inner(FILE *fp,
           struct mg_connection *conn,
           char *buf,
           int len,
           double timeout)
{
	int nread, err = 0;

#if defined(_WIN32)
	typedef int len_t;
#else
	typedef size_t len_t;
#endif

	/* We need an additional wait loop around this, because in some cases
	 * with TLSwe may get data from the socket but not from SSL_read.
	 * In this case we need to repeat at least once.
	 */

	if (fp != NULL) {
		/* Use read() instead of fread(), because if we're reading from the
		 * CGI pipe, fread() may block until IO buffer is filled up. We
		 * cannot afford to block and must pass all read bytes immediately
		 * to the client. */
		nread = (int)read(fileno(fp), buf, (size_t)len);

		err = (nread < 0) ? ERRNO : 0;
		if ((nread == 0) && (len > 0)) {
			/* Should get data, but got EOL */
			return -2;
		}

#if defined(USE_MBEDTLS)
	} else if (conn->ssl != NULL) {
		struct mg_pollfd pfd[1];
		int to_read;
		int pollres;

		to_read = mbedtls_ssl_get_bytes_avail(conn->ssl);

		if (to_read > 0) {
			/* We already know there is no more data buffered in conn->buf
			 * but there is more available in the SSL layer. So don't poll
			 * conn->client.sock yet. */

			pollres = 1;
			if (to_read > len)
				to_read = len;
		} else {
			pfd[0].fd = conn->client.sock;
			pfd[0].events = POLLIN;

			to_read = len;

			pollres = mg_poll(pfd,
			                  1,
			                  (int)(timeout * 1000.0),
			                  &(conn->phys_ctx->stop_flag));

			if (!STOP_FLAG_IS_ZERO(&conn->phys_ctx->stop_flag)) {
				return -2;
			}
		}

		if (pollres > 0) {
			nread = mbed_ssl_read(conn->ssl, (unsigned char *)buf, to_read);
			if (nread <= 0) {
				if ((nread == MBEDTLS_ERR_SSL_WANT_READ)
				    || (nread == MBEDTLS_ERR_SSL_WANT_WRITE)
				    || nread == MBEDTLS_ERR_SSL_ASYNC_IN_PROGRESS) {
					nread = 0;
				} else {
					fprintf(stderr, "SSL read failed, error %d\n", nread);
					return -2;
				}
			} else {
				err = 0;
			}

		} else if (pollres < 0) {
			/* Error */
			return -2;
		} else {
			/* pollres = 0 means timeout */
			nread = 0;
		}

#elif !defined(NO_SSL)
	} else if (conn->ssl != NULL) {
		int ssl_pending;
		struct mg_pollfd pfd[1];
		int pollres;

		if ((ssl_pending = SSL_pending(conn->ssl)) > 0) {
			/* We already know there is no more data buffered in conn->buf
			 * but there is more available in the SSL layer. So don't poll
			 * conn->client.sock yet. */
			if (ssl_pending > len) {
				ssl_pending = len;
			}
			pollres = 1;
		} else {
			pfd[0].fd = conn->client.sock;
			pfd[0].events = POLLIN;
			pollres = mg_poll(pfd,
			                  1,
			                  (int)(timeout * 1000.0),
			                  &(conn->phys_ctx->stop_flag));
			if (!STOP_FLAG_IS_ZERO(&conn->phys_ctx->stop_flag)) {
				return -2;
			}
		}
		if (pollres > 0) {
			ERR_clear_error();
			nread =
			    SSL_read(conn->ssl, buf, (ssl_pending > 0) ? ssl_pending : len);
			if (nread <= 0) {
				err = SSL_get_error(conn->ssl, nread);
				if ((err == SSL_ERROR_SYSCALL) && (nread == -1)) {
					err = ERRNO;
				} else if ((err == SSL_ERROR_WANT_READ)
				           || (err == SSL_ERROR_WANT_WRITE)) {
					nread = 0;
				} else {
					/* All errors should return -2 */
					DEBUG_TRACE("SSL_read() failed, error %d", err);
					ERR_clear_error();
					return -2;
				}
				ERR_clear_error();
			} else {
				err = 0;
			}
		} else if (pollres < 0) {
			/* Error */
			return -2;
		} else {
			/* pollres = 0 means timeout */
			nread = 0;
		}
#endif

	} else {
		struct mg_pollfd pfd[1];
		int pollres;

		pfd[0].fd = conn->client.sock;
		pfd[0].events = POLLIN;
		pollres = mg_poll(pfd,
		                  1,
		                  (int)(timeout * 1000.0),
		                  &(conn->phys_ctx->stop_flag));
		if (!STOP_FLAG_IS_ZERO(&conn->phys_ctx->stop_flag)) {
			return -2;
		}
		if (pollres > 0) {
			nread = (int)recv(conn->client.sock, buf, (len_t)len, 0);
			err = (nread < 0) ? ERRNO : 0;
			if (nread <= 0) {
				/* shutdown of the socket at client side */
				return -2;
			}
		} else if (pollres < 0) {
			/* error calling poll */
			return -2;
		} else {
			/* pollres = 0 means timeout */
			nread = 0;
		}
	}

	if (!STOP_FLAG_IS_ZERO(&conn->phys_ctx->stop_flag)) {
		return -2;
	}

	if ((nread > 0) || ((nread == 0) && (len == 0))) {
		/* some data has been read, or no data was requested */
		return nread;
	}

	if (nread < 0) {
		/* socket error - check errno */
#if defined(_WIN32)
		if (err == WSAEWOULDBLOCK) {
			/* TODO (low): check if this is still required */
			/* standard case if called from close_socket_gracefully */
			return -2;
		} else if (err == WSAETIMEDOUT) {
			/* TODO (low): check if this is still required */
			/* timeout is handled by the while loop  */
			return 0;
		} else if (err == WSAECONNABORTED) {
			/* See https://www.chilkatsoft.com/p/p_299.asp */
			return -2;
		} else {
			DEBUG_TRACE("recv() failed, error %d", err);
			return -2;
		}
#else
		/* TODO: POSIX returns either EAGAIN or EWOULDBLOCK in both cases,
		 * if the timeout is reached and if the socket was set to non-
		 * blocking in close_socket_gracefully, so we can not distinguish
		 * here. We have to wait for the timeout in both cases for now.
		 */
		if (ERROR_TRY_AGAIN(err)) {
			/* TODO (low): check if this is still required */
			/* EAGAIN/EWOULDBLOCK:
			 * standard case if called from close_socket_gracefully
			 * => should return -1 */
			/* or timeout occurred
			 * => the code must stay in the while loop */

			/* EINTR can be generated on a socket with a timeout set even
			 * when SA_RESTART is effective for all relevant signals
			 * (see signal(7)).
			 * => stay in the while loop */
		} else {
			DEBUG_TRACE("recv() failed, error %d", err);
			return -2;
		}
#endif
	}

	/* Timeout occurred, but no data available. */
	return -1;
}